

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O2

void __thiscall Memory::HeapAllocator::ClearTrackAllocInfo(HeapAllocator *this,TrackAllocData *data)

{
  code *pcVar1;
  type_info *ptVar2;
  size_t sVar3;
  char *pcVar4;
  undefined4 uVar5;
  bool bVar6;
  TrackAllocData *this_00;
  undefined4 *puVar7;
  
  this_00 = (TrackAllocData *)__tls_get_addr(&PTR_013e5fd8);
  bVar6 = TrackAllocData::IsEmpty(this_00);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapAllocator.cpp"
                       ,0xd3,"(!nextAllocData.IsEmpty())","!nextAllocData.IsEmpty()");
    if (!bVar6) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  if (data != (TrackAllocData *)0x0) {
    uVar5 = *(undefined4 *)&this_00->field_0x24;
    data->line = this_00->line;
    *(undefined4 *)&data->field_0x24 = uVar5;
    ptVar2 = this_00->typeinfo;
    sVar3 = this_00->plusSize;
    pcVar4 = this_00->filename;
    data->count = this_00->count;
    data->filename = pcVar4;
    data->typeinfo = ptVar2;
    data->plusSize = sVar3;
  }
  this_00->typeinfo = (type_info *)0x0;
  this_00->plusSize = 0;
  this_00->count = 0;
  return;
}

Assistant:

void HeapAllocator::ClearTrackAllocInfo(TrackAllocData* data/* = NULL*/)
{
#ifdef HEAP_TRACK_ALLOC
    Assert(!nextAllocData.IsEmpty());
    if (data)
    {
        *data = nextAllocData;
    }
    nextAllocData.Clear();
#endif
}